

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void * lj_mem_newgco(lua_State *L,GCSize size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)(L->glref).ptr64;
  puVar2 = (undefined8 *)(*(code *)*puVar1)(puVar1[1],0,0,size);
  if (puVar2 != (undefined8 *)0x0) {
    puVar1[2] = puVar1[2] + size;
    *puVar2 = puVar1[5];
    puVar1[5] = puVar2;
    *(byte *)(puVar2 + 1) = *(byte *)(puVar1 + 4) & 3;
    return puVar2;
  }
  lj_err_mem(L);
}

Assistant:

void * LJ_FASTCALL lj_mem_newgco(lua_State *L, GCSize size)
{
  global_State *g = G(L);
  GCobj *o = (GCobj *)g->allocf(g->allocd, NULL, 0, size);
  if (o == NULL)
    lj_err_mem(L);
  lj_assertG(checkptrGC(o),
	     "allocated memory address %p outside required range", o);
  g->gc.total += size;
  setgcrefr(o->gch.nextgc, g->gc.root);
  setgcref(g->gc.root, o);
  newwhite(g, o);
  return o;
}